

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsModule.c
# Opt level: O0

cs_err option(cs_struct *handle,cs_opt_type type,size_t value)

{
  cs_mode value_00;
  size_t value_local;
  cs_opt_type type_local;
  cs_struct *handle_local;
  
  value_00 = (cs_mode)value;
  if (type == CS_OPT_SYNTAX) {
    ARM_getRegName(handle,value_00);
    handle->syntax = value_00;
  }
  else if (type == CS_OPT_MODE) {
    if ((value & 0x10) == 0) {
      handle->disasm = ARM_getInstruction;
    }
    else {
      handle->disasm = Thumb_getInstruction;
    }
    handle->mode = value_00;
  }
  return CS_ERR_OK;
}

Assistant:

static cs_err option(cs_struct *handle, cs_opt_type type, size_t value)
{
	if (type == CS_OPT_MODE) {
		if (value & CS_MODE_32)
			handle->disasm = Mips_getInstruction;
		else
			handle->disasm = Mips64_getInstruction;

		handle->mode = value;
	}
	return CS_ERR_OK;
}